

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O0

void __thiscall UnitTest1::CodeGenTest::MatchCodeGenTest1(CodeGenTest *this)

{
  void *local_288;
  void *local_280;
  undefined8 *local_278;
  char *buf;
  allocator local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  MatchRoutineEM64T<char> match_routine;
  char str1 [43];
  CodeGenTest *this_local;
  
  match_routine.m_code._namedLabels.super_ZoneHashBase._embedded[0] =
       (ZoneHashNode *)0x206b636975712041;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,
             (char *)match_routine.m_code._namedLabels.super_ZoneHashBase._embedded,&local_259);
  Centaurus::MatchRoutineEM64T<char>::MatchRoutineEM64T
            ((MatchRoutineEM64T<char> *)local_238,&local_258,(Logger *)0x0);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  local_278 = (undefined8 *)malloc(0x30);
  *(undefined8 *)((long)local_278 + 0xb) = 0x6a20786f66206e77;
  *(undefined8 *)((long)local_278 + 0x13) = 0x65766f2073706d75;
  *(undefined8 *)((long)local_278 + 0x1b) = 0x616c206568742072;
  builtin_strncpy((char *)((long)local_278 + 0x23),"zy dog.",8);
  *local_278 = match_routine.m_code._namedLabels.super_ZoneHashBase._embedded[0];
  local_278[1] = 0x6f66206e776f7262;
  local_278[2] = 0x2073706d756a2078;
  local_278[3] = 0x656874207265766f;
  local_280 = (void *)((long)local_278 + 0x2a);
  local_288 = Centaurus::MatchRoutineEM64T<char>::operator()
                        ((MatchRoutineEM64T<char> *)local_238,local_278);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_280,&local_288,(wchar_t *)0x0);
  Centaurus::MatchRoutineEM64T<char>::~MatchRoutineEM64T((MatchRoutineEM64T<char> *)local_238);
  return;
}

Assistant:

TEST_METHOD(MatchCodeGenTest1)
    {
        using namespace Centaurus;

        const char str1[] = "A quick brown fox jumps over the lazy dog.";

        MatchRoutineEM64T<char> match_routine(str1);

        char *buf = (char *)malloc((sizeof(str1) + 15) / 16 * 16);
        memcpy(buf, str1, sizeof(str1));

        Assert::AreEqual((const void *)(buf + sizeof(str1) - 1), match_routine(buf));
    }